

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGReader.cpp
# Opt level: O2

void CFGReader::markIndirect(CfgNode *node)

{
  uint __line;
  char *__assertion;
  
  if (node->m_type == CFG_BLOCK) {
    if ((BlockData *)node->m_data != (BlockData *)0x0) {
      CfgNode::BlockData::setIndirect((BlockData *)node->m_data,true);
      return;
    }
    __assertion = "data != 0";
    __line = 0x78;
  }
  else {
    __assertion = "node->type() == CfgNode::CFG_BLOCK";
    __line = 0x75;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGReader.cpp"
                ,__line,"static void CFGReader::markIndirect(CfgNode *)");
}

Assistant:

void CFGReader::markIndirect(CfgNode* node) {
	assert(node->type() == CfgNode::CFG_BLOCK);
	CfgNode::BlockData* data =
		static_cast<CfgNode::BlockData*>(node->data());
	assert(data != 0);
	data->setIndirect(true);
}